

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

Reg ra_rematk(ASMState *as,IRRef ref)

{
  IRIns *ir;
  byte bVar1;
  IROp1 IVar2;
  int iVar3;
  long lVar4;
  uint rr;
  ulong uVar5;
  
  ir = as->ir + ref;
  bVar1 = (ir->field_1).r;
  iVar3 = 1 << (bVar1 & 0x1f);
  uVar5._0_4_ = as->freeset;
  uVar5._4_4_ = as->modset;
  uVar5 = CONCAT44(iVar3,iVar3) | uVar5;
  as->freeset = (int)uVar5;
  as->modset = (int)(uVar5 >> 0x20);
  (ir->field_1).r = 0xff;
  IVar2 = (ir->field_1).o;
  rr = (uint)bVar1;
  if (IVar2 == '\r') {
    (ir->field_1).r = 0x82;
    lVar4 = -0xb8;
  }
  else {
    if (IVar2 != '\x16') {
      if (IVar2 == '\x1d') {
        emit_loadu64(as,(uint)bVar1,(uint64_t)ir[1]);
        return rr;
      }
      if (IVar2 == '\x1c') {
        emit_loadk64(as,rr,ir);
        return rr;
      }
      emit_loadi(as,rr,ir->i);
      return rr;
    }
    lVar4 = -0xc0;
  }
  emit_rma(as,XO_MOV,rr,(void *)((long)&(as->J->cur).nextgc.gcptr32 + lVar4));
  return rr;
}

Assistant:

static Reg ra_rematk(ASMState *as, IRRef ref)
{
  IRIns *ir;
  Reg r;
  if (ra_iskref(ref)) {
    r = ra_krefreg(ref);
    lj_assertA(!rset_test(as->freeset, r), "rematk of free reg %d", r);
    ra_free(as, r);
    ra_modified(as, r);
#if LJ_64
    emit_loadu64(as, r, ra_krefk(as, ref));
#else
    emit_loadi(as, r, ra_krefk(as, ref));
#endif
    return r;
  }
  ir = IR(ref);
  r = ir->r;
  lj_assertA(ra_hasreg(r), "rematk of K%03d has no reg", REF_BIAS - ref);
  lj_assertA(!ra_hasspill(ir->s),
	     "rematk of K%03d has spill slot [%x]", REF_BIAS - ref, ir->s);
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;  /* Do not keep any hint. */
  RA_DBGX((as, "remat     $i $r", ir, r));
#if !LJ_SOFTFP32
  if (ir->o == IR_KNUM) {
    emit_loadk64(as, r, ir);
  } else
#endif
  if (emit_canremat(REF_BASE) && ir->o == IR_BASE) {
    ra_sethint(ir->r, RID_BASE);  /* Restore BASE register hint. */
    emit_getgl(as, r, jit_base);
  } else if (emit_canremat(ASMREF_L) && ir->o == IR_KPRI) {
    /* REF_NIL stores ASMREF_L register. */
    lj_assertA(irt_isnil(ir->t), "rematk of bad ASMREF_L");
    emit_getgl(as, r, cur_L);
#if LJ_64
  } else if (ir->o == IR_KINT64) {
    emit_loadu64(as, r, ir_kint64(ir)->u64);
#if LJ_GC64
  } else if (ir->o == IR_KGC) {
    emit_loadu64(as, r, (uintptr_t)ir_kgc(ir));
  } else if (ir->o == IR_KPTR || ir->o == IR_KKPTR) {
    emit_loadu64(as, r, (uintptr_t)ir_kptr(ir));
#endif
#endif
  } else {
    lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
	       ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
	       "rematk of bad IR op %d", ir->o);
    emit_loadi(as, r, ir->i);
  }
  return r;
}